

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib540.c
# Opt level: O2

int loop(int num,CURLM *cm,char *url,char *userpwd,curl_slist *headers)

{
  uint __i;
  int iVar1;
  CURL *pCVar2;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  CURL **ppCVar6;
  undefined8 uVar7;
  int *piVar8;
  undefined8 uVar9;
  char *pcVar10;
  timeval tVar11;
  timeval older;
  timeval older_00;
  undefined8 uStack_1f0;
  int U;
  int M;
  int Q;
  undefined8 local_1d0;
  timeval local_1c8;
  long L;
  fd_set E;
  fd_set W;
  fd_set R;
  
  U = -1;
  pCVar2 = (CURL *)curl_easy_init();
  eh[(uint)num] = pCVar2;
  if (pCVar2 == (CURL *)0x0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib540.c"
                  ,0x36);
    iVar1 = 0x7c;
  }
  else {
    iVar1 = curl_easy_setopt(pCVar2,0x2712,url);
    uVar9 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(eh[(uint)num],0x2714,libtest_arg2);
      uVar9 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(eh[(uint)num],0x2716,userpwd);
        uVar9 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_easy_setopt(eh[(uint)num],0x6f,0xffffffffffffffef);
          uVar9 = _stderr;
          if (iVar1 == 0) {
            iVar1 = curl_easy_setopt(eh[(uint)num],0x29,1);
            uVar9 = _stderr;
            if (iVar1 == 0) {
              iVar1 = curl_easy_setopt(eh[(uint)num],0x2a,1);
              uVar9 = _stderr;
              if (iVar1 == 0) {
                iVar1 = curl_easy_setopt(eh[(uint)num],0x2727,headers);
                uVar9 = _stderr;
                if (iVar1 == 0) {
                  iVar1 = curl_multi_add_handle(cm,eh[(uint)num]);
                  uVar9 = _stderr;
                  if (iVar1 == 0) {
                    iVar1 = -1;
                    do {
                      if (iVar1 == 0) {
                        return 0;
                      }
                      M = -99;
                      iVar1 = curl_multi_perform(cm,&U);
                      uVar9 = _stderr;
                      if (iVar1 != 0) {
                        uVar7 = curl_multi_strerror(iVar1);
                        pcVar10 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
                        uVar3 = 0x76;
                        goto LAB_00102a46;
                      }
                      if (U < 0) {
                        pcVar10 = 
                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                        ;
                        uVar9 = 0x76;
LAB_00102a14:
                        curl_mfprintf(_stderr,pcVar10,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib540.c"
                                      ,uVar9);
                        return 0x7a;
                      }
                      tVar11 = tutil_tvnow();
                      older.tv_usec = tv_test_start.tv_usec;
                      older.tv_sec = tv_test_start.tv_sec;
                      lVar4 = tutil_tvdiff(tVar11,older);
                      if (60000 < lVar4) {
                        uVar9 = 0x7a;
                        goto LAB_001029c9;
                      }
                      if (U != 0) {
                        for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
                          R.__fds_bits[lVar4] = 0;
                        }
                        for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
                          W.__fds_bits[lVar4] = 0;
                        }
                        for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
                          E.__fds_bits[lVar4] = 0;
                        }
                        iVar1 = curl_multi_fdset(cm,&R,&W,&E,&M);
                        uVar9 = _stderr;
                        if (iVar1 != 0) {
                          uVar7 = curl_multi_strerror(iVar1);
                          pcVar10 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
                          uVar3 = 0x83;
LAB_00102a46:
                          curl_mfprintf(uVar9,pcVar10,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib540.c"
                                        ,uVar3,iVar1,uVar7);
                          return iVar1;
                        }
                        if (M < -1) {
                          pcVar10 = 
                          "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                          ;
                          uVar9 = 0x83;
                          goto LAB_00102a14;
                        }
                        iVar1 = curl_multi_timeout(cm,&L);
                        uVar9 = _stderr;
                        if (iVar1 != 0) {
                          uVar7 = curl_multi_strerror(iVar1);
                          pcVar10 = "%s:%d curl_multi_timeout() failed, with code %d (%s)\n";
                          uVar3 = 0x89;
                          goto LAB_00102a46;
                        }
                        if (L < -1) {
                          curl_mfprintf(_stderr,
                                        "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib540.c"
                                        ,0x89,L);
                          return 0x73;
                        }
                        if (L == -1) {
                          local_1c8.tv_sec = 5;
                          local_1c8.tv_usec = 0;
                        }
                        else {
                          uVar5 = L;
                          if (0x7ffffffe < (ulong)L) {
                            uVar5 = 0x7fffffff;
                          }
                          local_1c8.tv_sec = (uVar5 & 0xffffffff) / 1000;
                          local_1c8.tv_usec =
                               (__suseconds_t)(uint)((int)((uVar5 & 0xffffffff) % 1000) * 1000);
                        }
                        iVar1 = select_wrapper(M + 1,&R,&W,&E,&local_1c8);
                        if (iVar1 == -1) {
                          piVar8 = __errno_location();
                          uVar9 = _stderr;
                          iVar1 = *piVar8;
                          pcVar10 = strerror(iVar1);
                          curl_mfprintf(uVar9,"%s:%d select() failed, with errno %d (%s)\n",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib540.c"
                                        ,0x99,iVar1,pcVar10);
                          return 0x79;
                        }
                      }
                      while (piVar8 = (int *)curl_multi_info_read(cm,&Q), piVar8 != (int *)0x0) {
                        if (*piVar8 == 1) {
                          pCVar2 = *(CURL **)(piVar8 + 2);
                          local_1d0 = _stderr;
                          iVar1 = piVar8[4];
                          uVar9 = curl_easy_strerror(iVar1);
                          curl_mfprintf(local_1d0,"R: %d - %s\n",iVar1,uVar9);
                          curl_multi_remove_handle(cm,pCVar2);
                          curl_easy_cleanup(pCVar2);
                          ppCVar6 = eh;
                          if ((eh[0] == pCVar2) || (ppCVar6 = eh + 1, eh[1] == pCVar2)) {
                            *ppCVar6 = (CURL *)0x0;
                          }
                        }
                        else {
                          curl_mfprintf(_stderr,"E: CURLMsg (%d)\n");
                        }
                      }
                      tVar11 = tutil_tvnow();
                      older_00.tv_usec = tv_test_start.tv_usec;
                      older_00.tv_sec = tv_test_start.tv_sec;
                      lVar4 = tutil_tvdiff(tVar11,older_00);
                      iVar1 = U;
                    } while (lVar4 < 0xea61);
                    uVar9 = 0xb1;
LAB_001029c9:
                    curl_mfprintf(_stderr,
                                  "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib540.c"
                                  ,uVar9);
                    return 0x7d;
                  }
                  uVar3 = curl_multi_strerror(iVar1);
                  pcVar10 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
                  uStack_1f0 = 0x56;
                }
                else {
                  uVar3 = curl_easy_strerror(iVar1);
                  pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                  uStack_1f0 = 0x52;
                }
              }
              else {
                uVar3 = curl_easy_strerror(iVar1);
                pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                uStack_1f0 = 0x4e;
              }
            }
            else {
              uVar3 = curl_easy_strerror(iVar1);
              pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
              uStack_1f0 = 0x4a;
            }
          }
          else {
            uVar3 = curl_easy_strerror(iVar1);
            pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
            uStack_1f0 = 0x46;
          }
        }
        else {
          uVar3 = curl_easy_strerror(iVar1);
          pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          uStack_1f0 = 0x42;
        }
      }
      else {
        uVar3 = curl_easy_strerror(iVar1);
        pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_1f0 = 0x3e;
      }
    }
    else {
      uVar3 = curl_easy_strerror(iVar1);
      pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      uStack_1f0 = 0x3a;
    }
    curl_mfprintf(uVar9,pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib540.c"
                  ,uStack_1f0,iVar1,uVar3);
  }
  curl_easy_cleanup(eh[(uint)num]);
  eh[(uint)num] = (CURL *)0x0;
  return iVar1;
}

Assistant:

static int loop(int num, CURLM *cm, const char *url, const char *userpwd,
                struct curl_slist *headers)
{
  CURLMsg *msg;
  long L;
  int Q, U = -1;
  fd_set R, W, E;
  struct timeval T;
  int res = 0;

  res = init(num, cm, url, userpwd, headers);
  if(res)
    return res;

  while(U) {

    int M = -99;

    res_multi_perform(cm, &U);
    if(res)
      return res;

    res_test_timedout();
    if(res)
      return res;

    if(U) {
      FD_ZERO(&R);
      FD_ZERO(&W);
      FD_ZERO(&E);

      res_multi_fdset(cm, &R, &W, &E, &M);
      if(res)
        return res;

      /* At this point, M is guaranteed to be greater or equal than -1. */

      res_multi_timeout(cm, &L);
      if(res)
        return res;

      /* At this point, L is guaranteed to be greater or equal than -1. */

      if(L != -1) {
        int itimeout = (L > (long)INT_MAX) ? INT_MAX : (int)L;
        T.tv_sec = itimeout/1000;
        T.tv_usec = (itimeout%1000)*1000;
      }
      else {
        T.tv_sec = 5;
        T.tv_usec = 0;
      }

      res_select_test(M + 1, &R, &W, &E, &T);
      if(res)
        return res;
    }

    while((msg = curl_multi_info_read(cm, &Q)) != NULL) {
      if(msg->msg == CURLMSG_DONE) {
        int i;
        CURL *e = msg->easy_handle;
        fprintf(stderr, "R: %d - %s\n", (int)msg->data.result,
                curl_easy_strerror(msg->data.result));
        curl_multi_remove_handle(cm, e);
        curl_easy_cleanup(e);
        for(i = 0; i < NUM_HANDLES; i++) {
          if(eh[i] == e) {
            eh[i] = NULL;
            break;
          }
        }
      }
      else
        fprintf(stderr, "E: CURLMsg (%d)\n", (int)msg->msg);
    }

    res_test_timedout();
    if(res)
      return res;
  }

  return 0; /* success */
}